

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strip.cpp
# Opt level: O0

void __thiscall wasm::Strip::run(Strip *this,Module *module)

{
  bool bVar1;
  vector<wasm::CustomSection,_std::allocator<wasm::CustomSection>_> *this_00;
  vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
  *this_01;
  reference this_02;
  pointer pFVar2;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *func;
  iterator __end3;
  iterator __begin3;
  vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
  *__range3;
  CustomSection temp;
  __normal_iterator<wasm::CustomSection_*,_std::vector<wasm::CustomSection,_std::allocator<wasm::CustomSection>_>_>
  local_80;
  const_iterator local_78;
  function<bool_(wasm::CustomSection_&)> local_60;
  __normal_iterator<wasm::CustomSection_*,_std::vector<wasm::CustomSection,_std::allocator<wasm::CustomSection>_>_>
  local_40;
  __normal_iterator<wasm::CustomSection_*,_std::vector<wasm::CustomSection,_std::allocator<wasm::CustomSection>_>_>
  local_38;
  __normal_iterator<wasm::CustomSection_*,_std::vector<wasm::CustomSection,_std::allocator<wasm::CustomSection>_>_>
  local_30;
  const_iterator local_28;
  vector<wasm::CustomSection,_std::allocator<wasm::CustomSection>_> *local_20;
  vector<wasm::CustomSection,_std::allocator<wasm::CustomSection>_> *sections;
  Module *module_local;
  Strip *this_local;
  
  this_00 = &module->customSections;
  local_20 = this_00;
  sections = (vector<wasm::CustomSection,_std::allocator<wasm::CustomSection>_> *)module;
  module_local = (Module *)this;
  local_38._M_current =
       (CustomSection *)
       std::vector<wasm::CustomSection,_std::allocator<wasm::CustomSection>_>::begin(this_00);
  local_40._M_current =
       (CustomSection *)
       std::vector<wasm::CustomSection,_std::allocator<wasm::CustomSection>_>::end(local_20);
  std::function<bool_(wasm::CustomSection_&)>::function(&local_60,&this->decider);
  local_30 = std::
             remove_if<__gnu_cxx::__normal_iterator<wasm::CustomSection*,std::vector<wasm::CustomSection,std::allocator<wasm::CustomSection>>>,std::function<bool(wasm::CustomSection&)>>
                       (local_38,local_40,&local_60);
  __gnu_cxx::
  __normal_iterator<wasm::CustomSection_const*,std::vector<wasm::CustomSection,std::allocator<wasm::CustomSection>>>
  ::__normal_iterator<wasm::CustomSection*>
            ((__normal_iterator<wasm::CustomSection_const*,std::vector<wasm::CustomSection,std::allocator<wasm::CustomSection>>>
              *)&local_28,&local_30);
  local_80._M_current =
       (CustomSection *)
       std::vector<wasm::CustomSection,_std::allocator<wasm::CustomSection>_>::end(local_20);
  __gnu_cxx::
  __normal_iterator<wasm::CustomSection_const*,std::vector<wasm::CustomSection,std::allocator<wasm::CustomSection>>>
  ::__normal_iterator<wasm::CustomSection*>
            ((__normal_iterator<wasm::CustomSection_const*,std::vector<wasm::CustomSection,std::allocator<wasm::CustomSection>>>
              *)&local_78,&local_80);
  temp.data.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_ =
       std::vector<wasm::CustomSection,_std::allocator<wasm::CustomSection>_>::erase
                 (this_00,local_28,local_78);
  std::function<bool_(wasm::CustomSection_&)>::~function(&local_60);
  CustomSection::CustomSection((CustomSection *)&__range3);
  std::__cxx11::string::operator=((string *)&__range3,BinaryConsts::CustomSections::Name);
  bVar1 = std::function<bool_(wasm::CustomSection_&)>::operator()
                    (&this->decider,(CustomSection *)&__range3);
  if (bVar1) {
    Module::clearDebugInfo((Module *)sections);
    this_01 = (vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
               *)(sections + 1);
    __end3 = std::
             vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
             ::begin(this_01);
    func = (unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)
           std::
           vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ::end(this_01);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_*,_std::vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>_>
                                       *)&func), bVar1) {
      this_02 = __gnu_cxx::
                __normal_iterator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_*,_std::vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>_>
                ::operator*(&__end3);
      pFVar2 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                         (this_02);
      Function::clearNames(pFVar2);
      pFVar2 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                         (this_02);
      Function::clearDebugInfo(pFVar2);
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_*,_std::vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>_>
      ::operator++(&__end3);
    }
  }
  CustomSection::~CustomSection((CustomSection *)&__range3);
  return;
}

Assistant:

void run(Module* module) override {
    // Remove name and debug sections.
    auto& sections = module->customSections;
    sections.erase(std::remove_if(sections.begin(), sections.end(), decider),
                   sections.end());
    // If we're cleaning up debug info, clear on the function and module too.
    CustomSection temp;
    temp.name = BinaryConsts::CustomSections::Name;
    if (decider(temp)) {
      module->clearDebugInfo();
      for (auto& func : module->functions) {
        func->clearNames();
        func->clearDebugInfo();
      }
    }
  }